

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

ExceptionOr<kj::Promise<unsigned_long>_> * __thiscall
kj::_::ExceptionOr<kj::Promise<unsigned_long>_>::operator=
          (ExceptionOr<kj::Promise<unsigned_long>_> *this,
          ExceptionOr<kj::Promise<unsigned_long>_> *param_1)

{
  Maybe<kj::Exception>::operator=((Maybe<kj::Exception> *)this,(Maybe<kj::Exception> *)param_1);
  Maybe<kj::Promise<unsigned_long>_>::operator=(&this->value,&param_1->value);
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;